

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O1

void * tcp_socket_sender_thread(void *arg)

{
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  pboolean pVar4;
  PSocket *socket;
  long lVar5;
  long lVar6;
  uint uVar7;
  undefined8 local_38;
  
  if (arg == (void *)0x0) {
    p_uthread_exit(0xffffffff);
  }
  socket = (PSocket *)p_socket_new(2,1,0,0);
  if (socket == (PSocket *)0x0) {
    p_uthread_exit(0xffffffff);
  }
  p_socket_set_timeout(socket,2000);
  iVar2 = p_socket_get_fd(socket);
  if (iVar2 < 0) {
    p_socket_free(socket);
    p_uthread_exit(0xffffffff);
  }
  while ((is_sender_working == 1 && (*(short *)((long)arg + 2) == 0))) {
    p_uthread_sleep(1);
  }
  lVar5 = p_socket_address_new("127.0.0.1",*arg);
  if (lVar5 == 0) {
    p_socket_free(socket);
    p_uthread_exit(0xffffffff);
  }
  iVar2 = p_socket_bind(socket,lVar5,0,0);
  if (iVar2 == 0) {
    p_socket_free(socket);
    p_socket_address_free(lVar5);
    p_uthread_exit(0xffffffff);
  }
  else {
    p_socket_address_free(lVar5);
    lVar5 = p_socket_get_local_address(socket,0);
    if (lVar5 == 0) {
      p_socket_free(socket);
      p_uthread_exit(0xffffffff);
    }
    uVar1 = p_socket_address_get_port(lVar5);
    *(undefined2 *)arg = uVar1;
    p_socket_address_free(lVar5);
  }
  while ((is_sender_working == 1 && (*(short *)((long)arg + 2) == 0))) {
    p_uthread_sleep(1);
  }
  uVar3 = 0;
  p_socket_set_blocking(socket,0);
  if (*(short *)((long)arg + 2) == 0) {
    local_38 = 0;
  }
  else {
    local_38 = p_socket_address_new("127.0.0.1",*(short *)((long)arg + 2));
    iVar2 = p_socket_connect(socket,local_38,0);
    if (((iVar2 == 0) && (iVar2 = p_socket_io_condition_wait(socket,2,0), iVar2 == 1)) &&
       (iVar2 = p_socket_check_connect_result(socket,0), iVar2 == 0)) {
      p_socket_address_free(local_38);
      p_socket_free(socket);
      p_uthread_exit(0xffffffff);
    }
    uVar3 = p_socket_is_connected(socket);
    if (uVar3 == 1) {
      iVar2 = p_socket_shutdown(socket,0,*(undefined4 *)((long)arg + 4),0);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
  if ((*(int *)((long)arg + 4) == 1) && (iVar2 = p_socket_is_closed(socket), iVar2 == 1)) {
    p_socket_address_free(local_38);
    p_socket_free(socket);
    p_uthread_exit(0xffffffff);
  }
  p_socket_set_blocking(socket,1);
  uVar7 = 0;
  if (is_sender_working == 1) {
    uVar7 = 0;
    lVar5 = 0;
    do {
      if (((uVar3 == 0) || (*(puint16 *)((long)arg + 2) == 0)) ||
         (pVar4 = test_socket_address(socket,*(puint16 *)((long)arg + 2)), pVar4 == 0)) break;
      if ((*(int *)((long)arg + 4) == 0) && (iVar2 = p_socket_is_connected(socket), iVar2 == 0)) {
        p_socket_address_free(local_38);
        p_socket_free(socket);
        p_uthread_exit(0xffffffff);
      }
      lVar6 = p_socket_send(socket,socket_data + lVar5,0x1c - lVar5,0);
      if (lVar6 < 1) {
        lVar6 = 0;
      }
      lVar6 = lVar6 + lVar5;
      lVar5 = 0;
      if (lVar6 != 0x1c) {
        lVar5 = lVar6;
      }
      uVar7 = uVar7 + (lVar6 == 0x1c);
      p_uthread_sleep(1);
    } while (is_sender_working == 1);
  }
  iVar2 = p_socket_close(socket,0);
  p_socket_address_free(local_38);
  p_socket_free(socket);
  p_uthread_exit(-(uint)(iVar2 == 0) | uVar7);
  return (void *)0x0;
}

Assistant:

static void * tcp_socket_sender_thread (void *arg)
{
	pint		send_counter = 0;
	psize		send_total;
	pssize		send_now;
	pboolean	is_connected = FALSE;

	if (arg == NULL)
		p_uthread_exit (-1);

	SocketTestData *data = (SocketTestData *) (arg);

	/* Create sender socket */
	PSocket *skt_sender = p_socket_new (P_SOCKET_FAMILY_INET,
					    P_SOCKET_TYPE_STREAM,
					    P_SOCKET_PROTOCOL_DEFAULT,
					    NULL);

	if (skt_sender == NULL)
		p_uthread_exit (-1);

	p_socket_set_timeout (skt_sender, 2000);

	if (p_socket_get_fd (skt_sender) < 0) {
		p_socket_free (skt_sender);
		p_uthread_exit (-1);
	}

	while (is_sender_working == TRUE && data->receiver_port == 0) {
		p_uthread_sleep (1);
		continue;
	}

	PSocketAddress *addr_sender = p_socket_address_new ("127.0.0.1", data->sender_port);

	if (addr_sender == NULL) {
		p_socket_free (skt_sender);
		p_uthread_exit (-1);
	}

	if (p_socket_bind (skt_sender, addr_sender, FALSE, NULL) == FALSE) {
		p_socket_free (skt_sender);
		p_socket_address_free (addr_sender);
		p_uthread_exit (-1);
	} else {
		p_socket_address_free (addr_sender);

		PSocketAddress *local_addr = p_socket_get_local_address (skt_sender, NULL);

		if (local_addr == NULL) {
			p_socket_free (skt_sender);
			p_uthread_exit (-1);
		}

		data->sender_port = p_socket_address_get_port (local_addr);

		p_socket_address_free (local_addr);
	}

	send_total = 0;

	while (is_sender_working == TRUE && data->receiver_port == 0) {
		p_uthread_sleep (1);
		continue;
	}

	PSocketAddress *addr_receiver = NULL;

	/* Try to connect in non-blocking mode */
	p_socket_set_blocking (skt_sender, FALSE);

	if (data->receiver_port != 0) {
		addr_receiver = p_socket_address_new ("127.0.0.1", data->receiver_port);
		is_connected = p_socket_connect (skt_sender, addr_receiver, NULL);

		if (is_connected == FALSE) {
			if (p_socket_io_condition_wait (skt_sender, P_SOCKET_IO_CONDITION_POLLOUT, NULL) == TRUE &&
			    p_socket_check_connect_result (skt_sender, NULL) == FALSE) {
				p_socket_address_free (addr_receiver);
				p_socket_free (skt_sender);
				p_uthread_exit (-1);
			}
		}

		is_connected = p_socket_is_connected (skt_sender);

		if (is_connected == TRUE && p_socket_shutdown (skt_sender,
							       FALSE,
							       data->shutdown_channel,
							       NULL) == FALSE)
			is_connected = FALSE;
	}

	if (data->shutdown_channel == TRUE && p_socket_is_closed (skt_sender) == TRUE) {
		p_socket_address_free (addr_receiver);
		p_socket_free (skt_sender);
		p_uthread_exit (-1);
	}

	p_socket_set_blocking (skt_sender, TRUE);

	while (is_sender_working == TRUE) {
		if (data->receiver_port == 0 || is_connected == FALSE)
			break;

		if (test_socket_address (skt_sender, data->receiver_port) == FALSE)
			break;

		if (data->shutdown_channel == FALSE && p_socket_is_connected (skt_sender) == FALSE) {
			p_socket_address_free (addr_receiver);
			p_socket_free (skt_sender);
			p_uthread_exit (-1);
		}

		send_now = p_socket_send (skt_sender,
					  socket_data + send_total,
					  sizeof (socket_data) - send_total,
					  NULL);

		if (send_now > 0)
			send_total += (psize) send_now;

		if (send_total == sizeof (socket_data)) {
			send_total = 0;
			++send_counter;
		}

		p_uthread_sleep (1);
	}

	if (p_socket_close (skt_sender, NULL) == FALSE)
		send_counter = -1;

	p_socket_address_free (addr_receiver);
	p_socket_free (skt_sender);
	p_uthread_exit (send_counter);

	return NULL;
}